

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::ClassDecl> __thiscall
mocker::Parser::classDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  size_t __n;
  size_t sVar2;
  Position end_00;
  Position end_01;
  Position end_02;
  Position end_03;
  Position end_04;
  Position end_05;
  bool bVar3;
  pointer psVar4;
  pointer psVar5;
  TokenID TVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  mapped_type *pmVar9;
  CompileError *pCVar10;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  shared_ptr<mocker::ast::ClassDecl> sVar12;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position beg_02;
  Position beg_03;
  Position beg_04;
  Position beg_05;
  Position beg_06;
  Position end_06;
  Position end_07;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  local_118;
  shared_ptr<mocker::ast::Identifier> *local_100;
  pointer local_f8;
  element_type *local_f0;
  shared_ptr<mocker::ast::CompoundStmt> body;
  shared_ptr<mocker::ast::Identifier> ident;
  shared_ptr<mocker::ast::Identifier> local_c8;
  shared_ptr<mocker::ast::Type> *local_b8;
  size_t local_b0;
  size_t local_a8;
  Parser local_a0;
  shared_ptr<mocker::ast::FuncDecl> ctor;
  shared_ptr<mocker::ast::Declaration> member;
  pair<mocker::Position,_mocker::Position> ctorPos;
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  members;
  
  Token::position(*end._M_current);
  psVar5 = local_118.
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = local_118.
           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var11._M_pi = extraout_RDX;
  if ((*end._M_current == in_RCX) ||
     (TVar6 = Token::tokenID(*end._M_current), _Var11._M_pi = extraout_RDX_00, TVar6 != Class)) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
LAB_0017f77f:
    sVar12.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var11._M_pi;
    sVar12.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ast::ClassDecl>)
           sVar12.super___shared_ptr<mocker::ast::ClassDecl,_(__gnu_cxx::_Lock_policy)2>;
  }
  *(long *)end._M_current = *(long *)end._M_current + 0x38;
  identifier((Parser *)&ident,iter,end);
  if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    end_02.col = (size_t)local_100;
    end_02.line = (size_t)local_118.
                          super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    beg_04.col = (size_t)psVar5;
    beg_04.line = (size_t)psVar4;
    CompileError::CompileError(pCVar10,beg_04,end_02);
  }
  else {
    pTVar1 = *end._M_current;
    *(Token **)end._M_current = pTVar1 + 1;
    if ((pTVar1 != in_RCX) && (TVar6 = Token::tokenID(pTVar1), TVar6 == LeftBrace)) {
      local_f8 = psVar4;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      members.
      super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0 = (element_type *)this;
      do {
        declaration((Parser *)&member,iter,end);
        if (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          if ((((*end._M_current != in_RCX) &&
               (TVar6 = Token::tokenID(*end._M_current), TVar6 == Identifier)) &&
              ((Token *)(*(long *)end._M_current + 0x38) != in_RCX)) &&
             (TVar6 = Token::tokenID((Token *)(*(long *)end._M_current + 0x38)), TVar6 == LeftParen)
             ) {
            pbVar8 = Token::val<std::__cxx11::string>(*end._M_current);
            __n = pbVar8->_M_string_length;
            if ((__n == ((ident.
                          super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->val)._M_string_length) &&
               ((__n == 0 ||
                (iVar7 = bcmp((pbVar8->_M_dataplus)._M_p,
                              ((ident.
                                super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->val)._M_dataplus._M_p,__n), iVar7 == 0)))) {
              if (in_RCX <= *end._M_current + 3) {
                pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
                Token::position(*end._M_current);
                end_03.col = (size_t)local_100;
                end_03.line = (size_t)local_118.
                                      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                beg_05.col = (size_t)psVar5;
                beg_05.line = (size_t)local_f8;
                CompileError::CompileError(pCVar10,beg_05,end_03);
                *(undefined ***)pCVar10 = &PTR__CompileError_001eba98;
                __cxa_throw(pCVar10,&SyntaxError::typeinfo,CompileError::~CompileError);
              }
              Token::position(*end._M_current);
              *(long *)end._M_current = *(long *)end._M_current + 0xa8;
              compoundStmt((Parser *)&body,iter,end);
              if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr == (element_type *)0x0) {
                pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
                Token::position(*end._M_current);
                end_04.col = (size_t)local_100;
                end_04.line = (size_t)local_118.
                                      super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                beg_06.col = (size_t)psVar5;
                beg_06.line = (size_t)local_f8;
                CompileError::CompileError(pCVar10,beg_06,end_04);
                *(undefined ***)pCVar10 = &PTR__CompileError_001eba98;
                __cxa_throw(pCVar10,&SyntaxError::typeinfo,CompileError::~CompileError);
              }
              local_a8 = ctorPos.first.line;
              local_b0 = ctorPos.first.col;
              local_a0.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                              *)body.
                                super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
              pmVar9 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)iter[2]._M_current,(key_type *)&local_a0.pos);
              sVar2 = (pmVar9->second).line;
              local_b8 = (shared_ptr<mocker::ast::Type> *)(pmVar9->second).col;
              local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              end_05.col = ctorPos.second.line;
              end_05.line = ctorPos.first.col;
              beg.col = ctorPos.first.line;
              beg.line = (size_t)iter;
              makeNode<mocker::ast::Identifier,char_const(&)[7]>
                        (&local_a0,beg,end_05,(char (*) [7])ctorPos.second.col);
              local_118.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_118.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_118.
              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              beg_00.col = local_a8;
              beg_00.line = (size_t)iter;
              end_06.col = sVar2;
              end_06.line = local_b0;
              makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
                        ((Parser *)&ctor,beg_00,end_06,local_b8,&local_c8,
                         (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                          *)&local_a0,(shared_ptr<mocker::ast::CompoundStmt> *)&local_118);
              std::
              vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              ::~vector(&local_118);
              if (local_a0.tokEnd._M_current != (Token *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a0.tokEnd._M_current);
              }
              if (local_c8.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_c8.
                           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
              ::emplace_back<std::shared_ptr<mocker::ast::FuncDecl>&>
                        ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                          *)&members,&ctor);
              if (ctor.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (ctor.
                           super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (body.
                           super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              bVar3 = true;
              goto LAB_0017f54a;
            }
          }
          bVar3 = false;
        }
        else {
          bVar3 = true;
          std::
          vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
          ::emplace_back<std::shared_ptr<mocker::ast::Declaration>&>
                    ((vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>
                      *)&members,&member);
        }
LAB_0017f54a:
        if (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (member.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      } while (bVar3);
      if ((*end._M_current == in_RCX) ||
         (TVar6 = Token::tokenID(*end._M_current), TVar6 != RightBrace)) {
        pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_01.col = (size_t)local_100;
        end_01.line = (size_t)local_118.
                              super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        beg_03.col = (size_t)psVar5;
        beg_03.line = (size_t)local_f8;
        CompileError::CompileError(pCVar10,beg_03,end_01);
        *(undefined ***)pCVar10 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar10,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      Token::position(pTVar1);
      beg_01.col = (size_t)local_f8;
      beg_01.line = (size_t)iter;
      end_07.col = (size_t)local_118.
                           super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      end_07.line = (size_t)psVar5;
      makeNode<mocker::ast::ClassDecl,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::Declaration>,std::allocator<std::shared_ptr<mocker::ast::Declaration>>>>
                ((Parser *)local_f0,beg_01,end_07,local_100,
                 (vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                  *)&ident);
      std::
      vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
      ::~vector(&members);
      _Var11._M_pi = extraout_RDX_01;
      this = (Parser *)local_f0;
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var11._M_pi = extraout_RDX_02;
        this = (Parser *)local_f0;
      }
      goto LAB_0017f77f;
    }
    pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    end_00.col = (size_t)local_100;
    end_00.line = (size_t)local_118.
                          super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    beg_02.col = (size_t)psVar5;
    beg_02.line = (size_t)psVar4;
    CompileError::CompileError(pCVar10,beg_02,end_00);
  }
  *(undefined ***)pCVar10 = &PTR__CompileError_001eba98;
  __cxa_throw(pCVar10,&SyntaxError::typeinfo,CompileError::~CompileError);
}

Assistant:

std::shared_ptr<ast::ClassDecl> Parser::classDecl(TokIter &iter, TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::Class)
    return nullptr;
  ++iter;
  auto ident = identifier(iter, end);
  if (!ident)
    throwError();
  if (id(iter++) != TokenID::LeftBrace)
    throwError();
  std::vector<std::shared_ptr<ast::Declaration>> members;
  while (true) {
    auto member = declaration(iter, end);
    if (member) {
      members.emplace_back(member);
      continue;
    }
    // ctor
    if (id(iter) == TokenID::Identifier && id(iter + 1) == TokenID::LeftParen &&
        iter->val<std::string>() == ident->val) {
      if (iter + 3 >= end)
        throwError();
      auto ctorPos = iter->position();
      iter += 3;
      auto body = compoundStmt(iter, end);
      if (!body)
        throwError();
      auto ctor = makeNode<ast::FuncDecl>(
          ctorPos.first, pos[body->getID()].second,
          std::shared_ptr<ast::Type>(nullptr),
          makeNode<ast::Identifier>(ctorPos.first, ctorPos.second, "_ctor_"),
          std::vector<std::shared_ptr<ast::VarDeclStmt>>(), body);
      members.emplace_back(ctor);
      continue;
    }
    break;
  }
  if (id(iter) != TokenID::RightBrace)
    throwError();
  return makeNode<ast::ClassDecl>(begPos, (iter++)->position().second, ident,
                                  std::move(members));
}